

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

char * sha256_End(SHA256_CTX *context,char *buffer)

{
  char *pcVar1;
  int local_44;
  sha2_byte **ppsStack_40;
  int i;
  sha2_byte *d;
  sha2_byte digest [32];
  char *buffer_local;
  SHA256_CTX *context_local;
  
  ppsStack_40 = &d;
  digest._24_8_ = buffer;
  if (buffer == (char *)0x0) {
    memzero(context,0x68);
  }
  else {
    sha256_Final(context,(sha2_byte *)&d);
    for (local_44 = 0; local_44 < 0x20; local_44 = local_44 + 1) {
      pcVar1 = (char *)(digest._24_8_ + 1);
      *(char *)digest._24_8_ = sha2_hex_digits[(int)(*(byte *)ppsStack_40 & 0xf0) >> 4];
      digest._24_8_ = digest._24_8_ + 2;
      *pcVar1 = sha2_hex_digits[(int)(*(byte *)ppsStack_40 & 0xf)];
      ppsStack_40 = (sha2_byte **)((long)ppsStack_40 + 1);
    }
    *(undefined1 *)digest._24_8_ = 0;
  }
  memzero(&d,0x20);
  return (char *)digest._24_8_;
}

Assistant:

char *sha256_End(trezor::SHA256_CTX* context, char buffer[]) {
	sha2_byte	digest[SHA256_DIGEST_LENGTH], *d = digest;
	int		i;

	if (buffer != (char*)0) {
		sha256_Final(context, digest);

		for (i = 0; i < SHA256_DIGEST_LENGTH; i++) {
			*buffer++ = sha2_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha2_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		memzero(context, sizeof(trezor::SHA256_CTX));
	}
	memzero(digest, SHA256_DIGEST_LENGTH);
	return buffer;
}